

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint32 ma_rb_available_write(ma_rb *pRB)

{
  ma_int32 mVar1;
  ma_uint32 mVar2;
  
  if (pRB == (ma_rb *)0x0) {
    mVar2 = 0;
  }
  else {
    mVar2 = pRB->subbufferSizeInBytes;
    mVar1 = ma_rb_pointer_distance(pRB);
    mVar2 = mVar2 - mVar1;
  }
  return mVar2;
}

Assistant:

MA_API ma_uint32 ma_rb_available_write(ma_rb* pRB)
{
    if (pRB == NULL) {
        return 0;
    }

    return (ma_uint32)(ma_rb_get_subbuffer_size(pRB) - ma_rb_pointer_distance(pRB));
}